

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TextureSwizzle::SmokeTest::captureAndVerify
          (SmokeTest *this,testCase *test_case,size_t output_format_index,GLint output_channel_size,
          size_t index_of_swizzled_channel)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLubyte result_image [1024];
  undefined1 local_438 [1032];
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_out_tex_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa21);
  (**(code **)(lVar3 + 0xaa0))
            (0xde1,0,*(undefined4 *)(&DAT_021cdf88 + output_format_index * 0x78),
             *(undefined4 *)(&DAT_021cdf8c + output_format_index * 0x78),local_438);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"getTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa24);
  (**(code **)(lVar3 + 0xb8))(0xde1,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa28);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,test_case,output_format_index,(ulong)(uint)output_channel_size,
             index_of_swizzled_channel,local_438);
  return;
}

Assistant:

void SmokeTest::captureAndVerify(const testCase& test_case, size_t output_format_index, glw::GLint output_channel_size,
								 size_t index_of_swizzled_channel)
{
	const _texture_format& output_format = texture_formats[output_format_index];

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Storage for image data */
	glw::GLubyte result_image[m_output_width * m_output_height * 4 /* channles */ * sizeof(glw::GLuint)];

	/* Get image data */
	gl.bindTexture(GL_TEXTURE_2D, m_out_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	gl.getTexImage(GL_TEXTURE_2D, 0 /* level */, output_format.m_format, output_format.m_type, result_image);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getTexImage");

	/* Unbind output texture */
	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Verification */
	verifyOutputImage(test_case, output_format_index, output_channel_size, index_of_swizzled_channel, result_image);
}